

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O2

void mocker::anon_unknown_1::storeVReg
               (shared_ptr<mocker::nasm::Register> *dest,shared_ptr<mocker::nasm::Addr> *val,
               RegMap<std::size_t> *offsets,Section *text)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  shared_ptr<mocker::nasm::Register> *__args_1;
  shared_ptr<mocker::nasm::MemoryAddr> memAddr;
  shared_ptr<mocker::nasm::MemoryAddr> local_30;
  long local_20;
  
  pmVar2 = std::__detail::
           _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)offsets,dest);
  mVar1 = *pmVar2;
  __args_1 = nasm::rbp();
  local_20 = -mVar1;
  std::
  make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
            ((shared_ptr<mocker::nasm::Register> *)&local_30,(unsigned_long *)__args_1);
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>const&>
            (text,&local_30,val);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void storeVReg(const std::shared_ptr<nasm::Register> &dest,
               const std::shared_ptr<nasm::Addr> &val,
               const RegMap<std::size_t> &offsets, nasm::Section &text) {
  auto offset = offsets.at(dest);
  auto memAddr = std::make_shared<nasm::MemoryAddr>(nasm::rbp(), -offset);
  text.emplaceInst<nasm::Mov>(memAddr, val);
}